

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathSubstringAfterFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathContextPtr ctxt_00;
  int iVar1;
  int iVar2;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr obj_00;
  xmlBufPtr buf;
  xmlChar *pxVar3;
  xmlXPathObjectPtr value;
  int iStack_40;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 2) {
    if (ctxt->valueFrame + 2 <= ctxt->valueNr) {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      obj = valuePop(ctxt);
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      obj_00 = valuePop(ctxt);
      buf = xmlBufCreate();
      if (buf != (xmlBufPtr)0x0) {
        pxVar3 = xmlStrstr(obj_00->stringval,obj->stringval);
        if (pxVar3 != (xmlChar *)0x0) {
          iVar2 = *(int *)&obj_00->stringval;
          iVar1 = xmlStrlen(obj->stringval);
          iVar1 = iVar1 + ((int)pxVar3 - iVar2);
          pxVar3 = obj_00->stringval;
          iVar2 = xmlStrlen(pxVar3);
          xmlBufAdd(buf,pxVar3 + iVar1,iVar2 - iVar1);
        }
        ctxt_00 = ctxt->context;
        pxVar3 = xmlBufContent(buf);
        value = xmlXPathCacheNewString(ctxt_00,pxVar3);
        valuePush(ctxt,value);
        xmlBufFree(buf);
      }
      xmlXPathReleaseObject(ctxt->context,obj_00);
      xmlXPathReleaseObject(ctxt->context,obj);
      return;
    }
    iStack_40 = 0x17;
  }
  else {
    iStack_40 = 0xc;
  }
  xmlXPathErr(ctxt,iStack_40);
  return;
}

Assistant:

void
xmlXPathSubstringAfterFunction(xmlXPathParserContextPtr ctxt, int nargs) {
  xmlXPathObjectPtr str;
  xmlXPathObjectPtr find;
  xmlBufPtr target;
  const xmlChar *point;
  int offset;

  CHECK_ARITY(2);
  CAST_TO_STRING;
  find = valuePop(ctxt);
  CAST_TO_STRING;
  str = valuePop(ctxt);

  target = xmlBufCreate();
  if (target) {
    point = xmlStrstr(str->stringval, find->stringval);
    if (point) {
      offset = point - str->stringval + xmlStrlen(find->stringval);
      xmlBufAdd(target, &str->stringval[offset],
		   xmlStrlen(str->stringval) - offset);
    }
    valuePush(ctxt, xmlXPathCacheNewString(ctxt->context,
	xmlBufContent(target)));
    xmlBufFree(target);
  }
  xmlXPathReleaseObject(ctxt->context, str);
  xmlXPathReleaseObject(ctxt->context, find);
}